

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.cpp
# Opt level: O1

void __thiscall PseudoTopoOrder::apply(PseudoTopoOrder *this,Path *P,int u,int v)

{
  int iVar1;
  _Elt_pointer pNVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  iterator iVar6;
  ulong uVar7;
  int *piVar8;
  pointer piVar9;
  int iVar10;
  _Elt_pointer pNVar11;
  _Elt_pointer pNVar12;
  _Map_pointer ppNVar13;
  vector<int,_std::allocator<int>_> indexesofPbetweenuandv;
  int index;
  vector<int,_std::allocator<int>_> nodesofPbetweenuandv;
  int *local_78;
  iterator iStack_70;
  int *local_68;
  int local_60;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  PseudoTopoOrder *local_38;
  
  local_78 = (int *)0x0;
  iStack_70._M_current = (int *)0x0;
  local_68 = (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  pNVar12 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pNVar2 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  local_38 = this;
  if (pNVar12 != pNVar2) {
    pNVar11 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppNVar13 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      iVar10 = (*pNVar12).node;
      local_5c = (local_38->pto_inverse).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar10];
      if (local_5c < v && u <= local_5c) {
        if (iStack_70._M_current == local_68) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_5c);
        }
        else {
          *iStack_70._M_current = local_5c;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
        local_60 = iVar10;
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_58,
                     (iterator)
                     local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_60);
        }
        else {
          *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar10;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      pNVar12 = pNVar12 + 1;
      if (pNVar12 == pNVar11) {
        pNVar12 = ppNVar13[1];
        ppNVar13 = ppNVar13 + 1;
        pNVar11 = pNVar12 + 0x40;
      }
    } while (pNVar12 != pNVar2);
  }
  iVar6._M_current = iStack_70._M_current;
  piVar8 = local_78;
  if (local_78 != iStack_70._M_current) {
    uVar7 = (long)iStack_70._M_current - (long)local_78 >> 2;
    lVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_78,iStack_70._M_current,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar8,iVar6._M_current);
  }
  if (local_78 != iStack_70._M_current) {
    piVar3 = (local_38->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (local_38->pto_inverse).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = local_78;
    piVar9 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      iVar10 = *piVar8;
      iVar1 = *piVar9;
      piVar3[iVar10] = iVar1;
      piVar4[iVar1] = iVar10;
      piVar8 = piVar8 + 1;
      piVar9 = piVar9 + 1;
    } while (piVar8 != iStack_70._M_current);
  }
  if (u < local_38->first_unknown) {
    local_38->first_unknown = u;
  }
  local_38->path_filled = false;
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78 != (int *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return;
}

Assistant:

void PseudoTopoOrder::apply(const Path& P, int u, int v)
{
// 	cout << "Before applying Q, we get: " << Value() << endl;

	std::vector<int> indexesofPbetweenuandv;
	std::vector<int> nodesofPbetweenuandv;

	for (auto x : P.get_path())
	{
		int index = pto_inverse[x];

		if (u <= index && index < v)
		{
			indexesofPbetweenuandv.push_back(index);
			nodesofPbetweenuandv.push_back(x);
// 			cout << "found " << x << " at " << index << endl;
		}
	}

	sort(indexesofPbetweenuandv.begin(), indexesofPbetweenuandv.end());
	int i = 0;

	for (auto p : indexesofPbetweenuandv)
	{
		pto[p] = nodesofPbetweenuandv[i];
		pto_inverse[pto[p]] = p;
		++i;
	}

// 	AnnounceModification(indexesofPbetweenuandv[0]);
	AnnounceModification(u);
// 	cout << "After applying Q, we get: " << Value() << endl;
}